

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-dump.c
# Opt level: O0

char * fy_simple_key_list_dump_format
                 (fy_parser *fyp,fy_simple_key_list *fyskl,fy_simple_key *fysk_highlight,char *buf,
                 size_t bufsz)

{
  int iVar1;
  fy_simple_key *pfVar2;
  size_t sVar3;
  char *pcVar4;
  char *pcVar5;
  fy_simple_key *local_48;
  fy_simple_key *fysk;
  char *e;
  char *s;
  size_t bufsz_local;
  char *buf_local;
  fy_simple_key *fysk_highlight_local;
  fy_simple_key_list *fyskl_local;
  fy_parser *fyp_local;
  
  local_48 = fy_simple_key_list_first(fyskl);
  e = buf;
  for (; local_48 != (fy_simple_key *)0x0; local_48 = fy_simple_key_next(fyskl,local_48)) {
    pfVar2 = fy_simple_key_list_first(fyskl);
    pcVar4 = "";
    if (local_48 != pfVar2) {
      pcVar4 = ",";
    }
    pcVar5 = "";
    if (fysk_highlight == local_48) {
      pcVar5 = "*";
    }
    iVar1 = snprintf(e,(size_t)(buf + ((bufsz - 1) - (long)e)),"%s%s",pcVar4,pcVar5);
    pcVar4 = e + iVar1;
    fy_simple_key_dump_format(fyp,local_48,pcVar4,(size_t)(buf + ((bufsz - 1) - (long)pcVar4)));
    sVar3 = strlen(pcVar4);
    e = pcVar4 + sVar3;
  }
  *e = '\0';
  return buf;
}

Assistant:

char *fy_simple_key_list_dump_format(struct fy_parser *fyp, struct fy_simple_key_list *fyskl,
                                     struct fy_simple_key *fysk_highlight, char *buf, size_t bufsz) {
    char *s, *e;
    struct fy_simple_key *fysk;

    s = buf;
    e = buf + bufsz - 1;
    for (fysk = fy_simple_key_list_first(fyskl); fysk; fysk = fy_simple_key_next(fyskl, fysk)) {

        s += snprintf(s, e - s, "%s%s",
                      fysk != fy_simple_key_list_first(fyskl) ? "," : "",
                      fysk_highlight == fysk ? "*" : "");

        fy_simple_key_dump_format(fyp, fysk, s, e - s);

        s += strlen(s);
    }
    *s = '\0';

    return buf;
}